

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O0

OPTIONHANDLER_RESULT OptionHandler_FeedOptions(OPTIONHANDLER_HANDLE handle,void *destinationHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  OPTION *pOVar3;
  undefined8 *puVar4;
  LOGGER_LOG l_1;
  OPTION *option;
  size_t i;
  size_t nOptions;
  LOGGER_LOG l;
  OPTIONHANDLER_RESULT result;
  void *destinationHandle_local;
  OPTIONHANDLER_HANDLE handle_local;
  
  if ((handle == (OPTIONHANDLER_HANDLE)0x0) || (destinationHandle == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/optionhandler.c"
                ,"OptionHandler_FeedOptions",0xe9,1,
                "invalid arguments OPTIONHANDLER_HANDLE handle=%p, void* destinationHandle=%p",
                handle,destinationHandle);
    }
    l._4_4_ = OPTIONHANDLER_INVALIDARG;
  }
  else {
    pOVar3 = (OPTION *)VECTOR_size(handle->storage);
    for (option = (OPTION *)0x0; option < pOVar3; option = (OPTION *)((long)&option->name + 1)) {
      puVar4 = (undefined8 *)VECTOR_element(handle->storage,(size_t)option);
      if ((puVar4 != (undefined8 *)0x0) &&
         (iVar1 = (*handle->setOption)(destinationHandle,(char *)*puVar4,(void *)puVar4[1]),
         iVar1 != 0)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/optionhandler.c"
                    ,"OptionHandler_FeedOptions",0xf8,1,
                    "failure while trying to SetOption with option %s",*puVar4);
        }
        break;
      }
    }
    l._4_4_ = (OPTIONHANDLER_RESULT)(option != pOVar3);
  }
  return l._4_4_;
}

Assistant:

OPTIONHANDLER_RESULT OptionHandler_FeedOptions(OPTIONHANDLER_HANDLE handle, void* destinationHandle)
{
    OPTIONHANDLER_RESULT result;
    /*Codes_SRS_OPTIONHANDLER_02_010: [ OptionHandler_FeedOptions shall fail and return OPTIONHANDLER_INVALIDARG if any argument is NULL. ]*/
    if (
        (handle == NULL) ||
        (destinationHandle == NULL)
        )
    {
        LogError("invalid arguments OPTIONHANDLER_HANDLE handle=%p, void* destinationHandle=%p", handle, destinationHandle);
        result = OPTIONHANDLER_INVALIDARG;
    }
    else
    {
        /*Codes_SRS_OPTIONHANDLER_02_011: [ Otherwise, OptionHandler_FeedOptions shall use VECTOR's iteration mechanisms to retrieve pairs of name, value (const char* and void*). ]*/
        size_t nOptions = VECTOR_size(handle->storage), i;
        for (i = 0;i < nOptions;i++)
        {
            OPTION* option = (OPTION*)VECTOR_element(handle->storage, i);
            if (option != NULL)
            {
                /*Codes_SRS_OPTIONHANDLER_02_012: [ OptionHandler_FeedOptions shall call for every pair of name,value setOption passing destinationHandle, name and value. ]*/
                if (handle->setOption(destinationHandle, option->name, option->storage) != 0)
                {
                    LogError("failure while trying to SetOption with option %s", option->name);
                    break;
                }
            }
        }

        if (i == nOptions)
        {
            /*Codes_SRS_OPTIONHANDLER_02_014: [ Otherwise, OptionHandler_FeedOptions shall fail and return OPTIONHANDLER_ERROR. ]*/
            result = OPTIONHANDLER_OK;
        }
        else
        {
            /*Codes_SRS_OPTIONHANDLER_02_013: [ If all the operations succeed then OptionHandler_FeedOptions shall succeed and return OPTIONHANDLER_OK. ]*/
            result = OPTIONHANDLER_ERROR;
        }
    }
    return result;
}